

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

GLMRegressor * __thiscall CoreML::Specification::Model::mutable_glmregressor(Model *this)

{
  GLMRegressor *this_00;
  
  if (this->_oneof_case_[0] == 300) {
    this_00 = (GLMRegressor *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 300;
    this_00 = (GLMRegressor *)operator_new(0x48);
    GLMRegressor::GLMRegressor(this_00);
    (this->Type_).glmregressor_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::GLMRegressor* Model::mutable_glmregressor() {
  if (!has_glmregressor()) {
    clear_Type();
    set_has_glmregressor();
    Type_.glmregressor_ = new ::CoreML::Specification::GLMRegressor;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.glmRegressor)
  return Type_.glmregressor_;
}